

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.c
# Opt level: O1

void mpack_start_map(mpack_writer_t *writer,uint32_t count)

{
  char *pcVar1;
  _Bool _Var2;
  uint8_t *u;
  long lVar3;
  ulong uVar4;
  
  if (count < 0x10) {
    if ((writer->end == writer->current) && (_Var2 = mpack_writer_ensure(writer,1), !_Var2)) {
      return;
    }
    *writer->current = (byte)count | 0x80;
    lVar3 = 1;
  }
  else {
    uVar4 = (long)writer->end - (long)writer->current;
    if (count < 0x10000) {
      if ((uVar4 < 3) && (_Var2 = mpack_writer_ensure(writer,3), !_Var2)) {
        return;
      }
      pcVar1 = writer->current;
      *pcVar1 = -0x22;
      *(ushort *)(pcVar1 + 1) = (ushort)count << 8 | (ushort)count >> 8;
      lVar3 = 3;
    }
    else {
      if ((uVar4 < 5) && (_Var2 = mpack_writer_ensure(writer,5), !_Var2)) {
        return;
      }
      pcVar1 = writer->current;
      *pcVar1 = -0x21;
      *(uint32_t *)(pcVar1 + 1) =
           count >> 0x18 | (count & 0xff0000) >> 8 | (count & 0xff00) << 8 | count << 0x18;
      lVar3 = 5;
    }
  }
  writer->current = writer->current + lVar3;
  return;
}

Assistant:

void mpack_start_map(mpack_writer_t* writer, uint32_t count) {
    mpack_writer_track_element(writer);

    if (count <= 15) {
        MPACK_WRITE_ENCODED(mpack_encode_fixmap, MPACK_TAG_SIZE_FIXMAP, (uint8_t)count);
    } else if (count <= UINT16_MAX) {
        MPACK_WRITE_ENCODED(mpack_encode_map16, MPACK_TAG_SIZE_MAP16, (uint16_t)count);
    } else {
        MPACK_WRITE_ENCODED(mpack_encode_map32, MPACK_TAG_SIZE_MAP32, (uint32_t)count);
    }

    mpack_writer_track_push(writer, mpack_type_map, count);
}